

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

bool __thiscall
QDockWidgetGroupWindow::hover(QDockWidgetGroupWindow *this,QLayoutItem *widgetItem,QPoint *mousePos)

{
  QArrayDataPointer<int> *this_00;
  _func_int **pp_Var1;
  Alignment AVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Data *pDVar6;
  QDockAreaLayoutItem *pQVar7;
  qsizetype qVar8;
  bool bVar9;
  compare_eq_result_container<QList<int>,_int> cVar10;
  DockOptions DVar11;
  QLayout *pQVar12;
  QLayout *pQVar13;
  QDockWidgetGroupWindow *this_01;
  QDockAreaLayoutInfo *pQVar14;
  iterator iVar15;
  int iVar16;
  TabMode tabMode;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo newState;
  QArrayDataPointer<int> local_f8;
  undefined1 local_d8 [40];
  undefined1 auStack_b0 [16];
  QMainWindow *pQStack_a0;
  QArrayDataPointer<QDockAreaLayoutItem> local_98;
  ulong uStack_80;
  QTabBar *local_78;
  Int IStack_70;
  undefined4 uStack_6c;
  QDockAreaLayoutItem local_68;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = QWidget::layout((QWidget *)this);
  bVar9 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)(pQVar12 + 8));
  if (bVar9) {
    pQVar13 = QWidget::layout((QWidget *)this);
    *(_func_int ***)(pQVar12 + 8) = pQVar13[4].super_QLayoutItem._vptr_QLayoutItem;
    QArrayDataPointer<QWidget_*>::operator=
              ((QArrayDataPointer<QWidget_*> *)&pQVar12[8].field_0x8,
               (QArrayDataPointer<QWidget_*> *)&pQVar13[4].super_QLayoutItem.align);
    AVar2.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         pQVar13[5].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>;
    uVar3 = *(undefined4 *)&pQVar13[5].super_QLayoutItem.field_0xc;
    pp_Var1 = *(_func_int ***)(pQVar13 + 6);
    uVar4 = *(undefined4 *)&pQVar13[6].field_0x8;
    uVar5 = *(undefined4 *)&pQVar13[6].field_0xc;
    *(_func_int ***)(pQVar12 + 9) = pQVar13[5].super_QLayoutItem._vptr_QLayoutItem;
    *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)&pQVar12[9].field_0x8 =
         AVar2.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i;
    *(undefined4 *)&pQVar12[9].field_0xc = uVar3;
    pQVar12[9].super_QLayoutItem._vptr_QLayoutItem = pp_Var1;
    pQVar12[9].super_QLayoutItem.align = (Alignment)uVar4;
    *(undefined4 *)&pQVar12[9].super_QLayoutItem.field_0xc = uVar5;
    QArrayDataPointer<QDockAreaLayoutItem>::operator=
              ((QArrayDataPointer<QDockAreaLayoutItem> *)(pQVar12 + 10),
               (QArrayDataPointer<QDockAreaLayoutItem> *)&pQVar13[6].super_QLayoutItem);
    uVar3 = *(undefined4 *)&pQVar13[7].field_0xc;
    pp_Var1 = pQVar13[7].super_QLayoutItem._vptr_QLayoutItem;
    pQVar12[10].super_QLayoutItem.align = (Alignment)*(undefined4 *)&pQVar13[7].field_0x8;
    *(undefined4 *)&pQVar12[10].super_QLayoutItem.field_0xc = uVar3;
    *(_func_int ***)(pQVar12 + 0xb) = pp_Var1;
    *(Int *)&pQVar12[0xb].field_0x8 =
         pQVar13[7].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i;
  }
  DVar11 = QMainWindow::dockOptions(*(QMainWindow **)(*(long *)(this + 8) + 0x10));
  local_d8._0_8_ = *(undefined8 *)(pQVar12 + 8);
  local_d8._8_8_ = *(undefined8 *)&pQVar12[8].field_0x8;
  local_d8._16_8_ = pQVar12[8].super_QLayoutItem._vptr_QLayoutItem;
  local_d8._24_8_ = *(undefined8 *)&pQVar12[8].super_QLayoutItem.align;
  if ((QArrayData *)local_d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_d8._8_8_)->ref_)->ref_)._q_value.super___atomic_base<int>.
    _M_i = (((QArrayData *)&((QArrayData *)local_d8._8_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d8._32_8_ = *(undefined8 *)(pQVar12 + 9);
  auStack_b0._0_4_ = *(undefined4 *)&pQVar12[9].field_0x8;
  auStack_b0._4_4_ = *(undefined4 *)&pQVar12[9].field_0xc;
  auStack_b0._8_8_ = pQVar12[9].super_QLayoutItem._vptr_QLayoutItem;
  pQStack_a0 = *(QMainWindow **)&pQVar12[9].super_QLayoutItem.align;
  local_98.d = *(Data **)(pQVar12 + 10);
  local_98.ptr = *(QDockAreaLayoutItem **)&pQVar12[10].field_0x8;
  local_98.size = (qsizetype)pQVar12[10].super_QLayoutItem._vptr_QLayoutItem;
  if (local_98.d != (Data *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  uStack_6c = 0xaaaaaaaa;
  IStack_70 = *(int *)&pQVar12[0xb].field_0x8;
  uStack_80 = *(ulong *)&pQVar12[10].super_QLayoutItem.align;
  local_78 = *(QTabBar **)(pQVar12 + 0xb);
  tabMode = (((uint)DVar11.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                    super_QFlagsStorage<QMainWindow::DockOption>.i & 10) != 2) + AllowTabs;
  (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
  this_01 = (QDockWidgetGroupWindow *)QMetaObject::cast((QObject *)&staticMetaObject);
  if (this_01 != (QDockWidgetGroupWindow *)0x0) {
    pQVar14 = tabLayoutInfo(this_01);
    if (pQVar14 == (QDockAreaLayoutInfo *)0x0) {
      tabMode = NoTabs;
    }
  }
  if (uStack_80._0_1_ == true) {
    pQVar14 = (QDockAreaLayoutInfo *)operator_new(0x70);
    pQVar14->sep = (int *)local_d8._0_8_;
    (pQVar14->separatorWidgets).d.d = (Data *)local_d8._8_8_;
    (pQVar14->separatorWidgets).d.ptr = (QWidget **)local_d8._16_8_;
    (pQVar14->separatorWidgets).d.size = local_d8._24_8_;
    if ((QArrayData *)local_d8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_d8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_d8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (pQVar14->rect).x2 = (Representation)auStack_b0._8_4_;
    (pQVar14->rect).y2 = (Representation)auStack_b0._12_4_;
    pQVar14->mainWindow = pQStack_a0;
    pQVar14->dockPos = local_d8._32_4_;
    pQVar14->o = local_d8._36_4_;
    (pQVar14->rect).x1 = (Representation)auStack_b0._0_4_;
    (pQVar14->rect).y1 = (Representation)auStack_b0._4_4_;
    (pQVar14->item_list).d.d = local_98.d;
    (pQVar14->item_list).d.ptr = local_98.ptr;
    (pQVar14->item_list).d.size = local_98.size;
    if (local_98.d != (Data *)0x0) {
      LOCK();
      ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar14->tabBarShape = IStack_70;
    *(ulong *)&pQVar14->tabbed = uStack_80;
    pQVar14->tabBar = local_78;
    QDockAreaLayoutItem::QDockAreaLayoutItem(&local_68,pQVar14);
    QArrayDataPointer<QDockAreaLayoutItem>::assign<QDockAreaLayoutItem_const*,q20::identity>
              ((QArrayDataPointer<QDockAreaLayoutItem> *)(local_d8 + 0x40),&local_68,local_40);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_68);
    iVar16 = *(int *)((long)&pQVar12[9].super_QLayoutItem._vptr_QLayoutItem + 4) -
             *(int *)&pQVar12[9].field_0xc;
    if (*(int *)&pQVar12[9].field_0x4 == 1) {
      iVar16 = *(int *)&pQVar12[9].super_QLayoutItem._vptr_QLayoutItem -
               *(int *)&pQVar12[9].field_0x8;
    }
    iVar15 = QList<QDockAreaLayoutItem>::begin((QList<QDockAreaLayoutItem> *)(local_d8 + 0x40));
    (iVar15.i)->size = iVar16 + 1;
    uStack_80 = uStack_80 & 0xffffffffffffff00;
    local_78 = (QTabBar *)0x0;
  }
  local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QDockAreaLayoutInfo::gapIndex
            ((QList<int> *)&local_f8,(QDockAreaLayoutInfo *)local_d8,mousePos,
             ((uint)DVar11.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                    super_QFlagsStorage<QMainWindow::DockOption>.i & 10) == 2,tabMode);
  this_00 = (QArrayDataPointer<int> *)(this + 0x38);
  cVar10 = QList<int>::operator==((QList<int> *)&local_f8,(QList<int> *)this_00);
  if (!cVar10) {
    bVar9 = QDockAreaLayoutInfo::hasGapItem((QDockAreaLayoutInfo *)local_d8,(QList<int> *)&local_f8)
    ;
    if (!bVar9) {
      QArrayDataPointer<int>::operator=(this_00,&local_f8);
      QDockAreaLayoutInfo::insertGap
                ((QDockAreaLayoutInfo *)local_d8,(QList<int> *)this_00,widgetItem);
      QDockAreaLayoutInfo::fitItems((QDockAreaLayoutInfo *)local_d8);
      pQVar12 = QWidget::layout((QWidget *)this);
      pQVar12[4].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_d8._0_8_;
      QArrayDataPointer<QWidget_*>::operator=
                ((QArrayDataPointer<QWidget_*> *)&pQVar12[4].super_QLayoutItem.align,
                 (QArrayDataPointer<QWidget_*> *)(local_d8 + 8));
      qVar8 = local_98.size;
      pQVar7 = local_98.ptr;
      pDVar6 = local_98.d;
      *(undefined8 *)(pQVar12 + 6) = auStack_b0._8_8_;
      *(QMainWindow **)&pQVar12[6].field_0x8 = pQStack_a0;
      pQVar12[5].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_d8._32_8_;
      *(undefined8 *)&pQVar12[5].super_QLayoutItem.align = auStack_b0._0_8_;
      local_98.d = (Data *)0x0;
      local_98.ptr = (QDockAreaLayoutItem *)0x0;
      local_98.size = 0;
      local_68.widgetItem = (QLayoutItem *)pQVar12[6].super_QLayoutItem._vptr_QLayoutItem;
      local_68.subinfo = *(QDockAreaLayoutInfo **)&pQVar12[6].super_QLayoutItem.align;
      pQVar12[6].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pDVar6;
      *(QDockAreaLayoutItem **)&pQVar12[6].super_QLayoutItem.align = pQVar7;
      local_68.placeHolderItem = *(QPlaceHolderItem **)(pQVar12 + 7);
      *(qsizetype *)(pQVar12 + 7) = qVar8;
      QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer
                ((QArrayDataPointer<QDockAreaLayoutItem> *)&local_68);
      pQVar12[7].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i = IStack_70;
      *(ulong *)&pQVar12[7].field_0x8 = uStack_80;
      pQVar12[7].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_78;
      updateCurrentGapRect(this);
      pQVar12 = QWidget::layout((QWidget *)this);
      QDockAreaLayoutInfo::apply
                ((QDockAreaLayoutInfo *)&pQVar12[4].super_QLayoutItem,
                 (bool)((byte)DVar11.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                              super_QFlagsStorage<QMainWindow::DockOption>.i & 1));
      bVar9 = true;
      goto LAB_0043663e;
    }
  }
  bVar9 = false;
LAB_0043663e:
  if (&(local_f8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d)->super_QArrayData,4,0x10);
    }
  }
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer
            ((QArrayDataPointer<QDockAreaLayoutItem> *)(local_d8 + 0x40));
  if ((QArrayData *)local_d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._8_8_,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetGroupWindow::hover(QLayoutItem *widgetItem, const QPoint &mousePos)
{
    QDockAreaLayoutInfo &savedState = static_cast<QDockWidgetGroupLayout *>(layout())->savedState;
    if (savedState.isEmpty())
        savedState = *layoutInfo();

    QMainWindow::DockOptions opts = static_cast<QMainWindow *>(parentWidget())->dockOptions();
    QDockAreaLayoutInfo newState = savedState;
    bool nestingEnabled =
        (opts & QMainWindow::AllowNestedDocks) && !(opts & QMainWindow::ForceTabbedDocks);
    QDockAreaLayoutInfo::TabMode tabMode =
#if !QT_CONFIG(tabbar)
        QDockAreaLayoutInfo::NoTabs;
#else
        nestingEnabled ? QDockAreaLayoutInfo::AllowTabs : QDockAreaLayoutInfo::ForceTabs;
    if (auto group = qobject_cast<QDockWidgetGroupWindow *>(widgetItem->widget())) {
        if (!group->tabLayoutInfo())
            tabMode = QDockAreaLayoutInfo::NoTabs;
    }
    if (newState.tabbed) {
        // insertion into a top-level tab
        newState.item_list = { QDockAreaLayoutItem(new QDockAreaLayoutInfo(newState)) };
        newState.item_list.first().size = pick(savedState.o, savedState.rect.size());
        newState.tabbed = false;
        newState.tabBar = nullptr;
    }
#endif

    auto newGapPos = newState.gapIndex(mousePos, nestingEnabled, tabMode);
    Q_ASSERT(!newGapPos.isEmpty());

    // Do not insert a new gap item, if the current position already is a gap,
    // or if the group window contains one
    if (newGapPos == currentGapPos || newState.hasGapItem(newGapPos))
        return false;

    currentGapPos = newGapPos;
    newState.insertGap(currentGapPos, widgetItem);
    newState.fitItems();
    *layoutInfo() = std::move(newState);
    updateCurrentGapRect();
    layoutInfo()->apply(opts & QMainWindow::AnimatedDocks);
    return true;
}